

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

PFN_vkVoidFunction Fossilize::interceptDeviceCommand(Instance *instance,char *pName)

{
  bool bVar1;
  int iVar2;
  anon_struct_24_3_069e73cf *cmd;
  anon_struct_24_3_069e73cf *__end1;
  anon_struct_24_3_069e73cf *__begin1;
  anon_struct_24_3_069e73cf (*__range1) [15];
  char *pName_local;
  Instance *instance_local;
  
  __end1 = interceptDeviceCommand::coreDeviceCommands;
  while( true ) {
    if (__end1 == (anon_struct_24_3_069e73cf *)&DAT_002448f8) {
      return (PFN_vkVoidFunction)0x0;
    }
    if ((((__end1->is_sampler & 1U) == 0) ||
        (bVar1 = Instance::recordsImmutableSamplers(instance), bVar1)) &&
       (iVar2 = strcmp(__end1->name,pName), iVar2 == 0)) break;
    __end1 = __end1 + 1;
  }
  return __end1->proc;
}

Assistant:

static PFN_vkVoidFunction interceptDeviceCommand(Instance *instance, const char *pName)
{
	static const struct
	{
		const char *name;
		PFN_vkVoidFunction proc;
		bool is_sampler;
	} coreDeviceCommands[] = {
		{ "vkGetDeviceProcAddr", reinterpret_cast<PFN_vkVoidFunction>(VK_LAYER_fossilize_GetDeviceProcAddr) },
		{ "vkDestroyDevice", reinterpret_cast<PFN_vkVoidFunction>(DestroyDevice) },

		{ "vkCreateDescriptorSetLayout", reinterpret_cast<PFN_vkVoidFunction>(CreateDescriptorSetLayout) },
		{ "vkCreatePipelineLayout", reinterpret_cast<PFN_vkVoidFunction>(CreatePipelineLayout) },
		{ "vkCreateGraphicsPipelines", reinterpret_cast<PFN_vkVoidFunction>(CreateGraphicsPipelines) },
		{ "vkCreateComputePipelines", reinterpret_cast<PFN_vkVoidFunction>(CreateComputePipelines) },
		{ "vkCreateSampler", reinterpret_cast<PFN_vkVoidFunction>(CreateSampler), true },
		{ "vkCreateShaderModule", reinterpret_cast<PFN_vkVoidFunction>(CreateShaderModule) },
		{ "vkCreateRenderPass", reinterpret_cast<PFN_vkVoidFunction>(CreateRenderPass) },
		{ "vkCreateRenderPass2", reinterpret_cast<PFN_vkVoidFunction>(CreateRenderPass2) },
		{ "vkCreateRenderPass2KHR", reinterpret_cast<PFN_vkVoidFunction>(CreateRenderPass2KHR) },
		{ "vkCreateSamplerYcbcrConversion", reinterpret_cast<PFN_vkVoidFunction>(CreateSamplerYcbcrConversion), true },
		{ "vkCreateSamplerYcbcrConversionKHR", reinterpret_cast<PFN_vkVoidFunction>(CreateSamplerYcbcrConversionKHR), true },
		{ "vkCreateRayTracingPipelinesKHR", reinterpret_cast<PFN_vkVoidFunction>(CreateRayTracingPipelinesKHR) },
		{ "vkCreatePipelineBinariesKHR", reinterpret_cast<PFN_vkVoidFunction>(CreatePipelineBinariesKHR) },
	};

	for (auto &cmd : coreDeviceCommands)
	{
		if (cmd.is_sampler && !instance->recordsImmutableSamplers())
			continue;

		if (strcmp(cmd.name, pName) == 0)
			return cmd.proc;
	}

	return nullptr;
}